

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void number_suite::test_double_infinity(void)

{
  string local_1f0 [36];
  undefined4 local_1cc;
  double local_1c8;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1c8 = std::numeric_limits<double>::infinity();
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value<double>
                           ((basic_encoder<char,_24UL> *)local_1a8,&local_1c8);
  local_1cc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::numeric_limits<double>::infinity())","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1e3,"void number_suite::test_double_infinity()",local_1c0,&local_1cc);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1e4,"void number_suite::test_double_infinity()",local_1f0,"null");
  std::__cxx11::string::~string(local_1f0);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_double_infinity()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::numeric_limits<double>::infinity()), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null");
}